

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall
cnn::Node::backward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
                   ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *pvVar5;
  undefined8 in_RCX;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  Tensor dEdxi_elem;
  Tensor dEdf_elem;
  Tensor fx_elem;
  size_t i_2;
  size_t i_1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  uint b;
  value_type *in_stack_fffffffffffffe28;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  undefined1 local_1b0 [36];
  uint in_stack_fffffffffffffe74;
  Tensor *in_stack_fffffffffffffe78;
  undefined1 local_168 [72];
  undefined1 local_120 [72];
  reference local_d8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_d0;
  ulong local_70;
  undefined1 local_68 [24];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_50;
  uint local_34;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_20;
  Dim *local_18;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x38))();
  if (((uVar3 & 1) == 0) && (uVar1 = Dim::batch_elems(local_18), uVar1 != 1)) {
    local_34 = 0;
    while (uVar1 = local_34, uVar2 = Dim::batch_elems(local_18), uVar1 < uVar2) {
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
                ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x4ef606);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)0x4ef613);
      for (local_70 = 0; uVar3 = local_70,
          sVar4 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size
                            (local_10), uVar3 < sVar4; local_70 = local_70 + 1) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                  (local_10,local_70);
        Tensor::batch_elem(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::push_back
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        Tensor::~Tensor((Tensor *)0x4ef69c);
      }
      local_d0 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x0;
      while (in_stack_fffffffffffffe30 = local_d0,
            pvVar5 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                     std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size
                               (local_10), in_stack_fffffffffffffe30 < pvVar5) {
        local_d8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                             (&local_50,(size_type)local_d0);
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::push_back
                  ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                   in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
        local_d0 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                   ((long)&(local_d0->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      Tensor::batch_elem(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      Tensor::batch_elem(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      Tensor::batch_elem(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      (**(code **)(*in_RDI + 0x30))(in_RDI,local_68,local_120,local_168,local_24,local_1b0);
      Tensor::~Tensor((Tensor *)0x4ef803);
      Tensor::~Tensor((Tensor *)0x4ef80d);
      Tensor::~Tensor((Tensor *)0x4ef81a);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                 CONCAT44(uVar1,in_stack_fffffffffffffe40));
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector
                ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                 CONCAT44(uVar1,in_stack_fffffffffffffe40));
      local_34 = local_34 + 1;
    }
  }
  else {
    (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,local_18,local_20,local_24,local_30);
  }
  return;
}

Assistant:

void Node::backward(const std::vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    backward_impl(xs, fx, dEdf, i, dEdxi);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      Tensor dEdf_elem(dEdf.batch_elem(b));
      Tensor dEdxi_elem(dEdxi.batch_elem(b));
      backward_impl(xs_ptrs, fx_elem, dEdf_elem, i, dEdxi_elem);
    }
  }
}